

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void SstStreamDestroy(SstStream Stream)

{
  StepRequest __ptr;
  CP_PeerConnection *pCVar1;
  SstStream in_RDI;
  int i_2;
  int i_1;
  FFSFormatList Tmp;
  FFSFormatList FFSList;
  int j;
  CP_PeerConnection *connections_to_reader;
  int i;
  StepRequest Request;
  _TimestepMetadataList *Next;
  _SstStream StackStream;
  int local_358;
  int local_354;
  FFSFormatBlock *in_stack_fffffffffffffcb0;
  FFSFormatList local_348;
  int local_33c;
  int local_32c;
  _TimestepMetadataList *p_Var2;
  SstStream Stream_00;
  undefined1 local_318 [168];
  
  CP_verbose(in_RDI,PerStepVerbose,"Destroying stream %p, name %s\n",in_RDI,in_RDI->Filename);
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  memcpy(local_318,in_RDI,0x310);
  in_RDI->Status = Destroyed;
  p_Var2 = in_RDI->Timesteps;
  while (p_Var2 != (_TimestepMetadataList *)0x0) {
    p_Var2 = p_Var2->Next;
    free(in_RDI->Timesteps);
    in_RDI->Timesteps = p_Var2;
  }
  Stream_00 = (SstStream)0x0;
  while (in_RDI->StepRequestQueue != (StepRequest)0x0) {
    __ptr = in_RDI->StepRequestQueue;
    in_RDI->StepRequestQueue = __ptr->Next;
    free(__ptr);
  }
  if (in_RDI->DP_Stream != (void *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
    if (in_RDI->Role == ReaderRole) {
      (*in_RDI->DP_Interface->destroyReader)(&Svcs,in_RDI->DP_Stream);
    }
    else {
      (*in_RDI->DP_Interface->destroyWriter)(&Svcs,in_RDI->DP_Stream);
    }
    in_RDI->DP_Stream = (void *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
  }
  if (in_RDI->Readers != (WS_ReaderInfo *)0x0) {
    for (local_32c = 0; local_32c < in_RDI->ReaderCount; local_32c = local_32c + 1) {
      pCVar1 = in_RDI->Readers[local_32c]->Connections;
      if (pCVar1 != (CP_PeerConnection *)0x0) {
        for (local_33c = 0; local_33c < in_RDI->Readers[local_32c]->ReaderCohortSize;
            local_33c = local_33c + 1) {
          if (pCVar1[local_33c].CMconn != (CMConnection)0x0) {
            CMConnection_dereference(pCVar1[local_33c].CMconn);
            pCVar1[local_33c].CMconn = (CMConnection)0x0;
          }
          free_attr_list(pCVar1[local_33c].ContactList);
        }
        free(in_RDI->Readers[local_32c]->Connections);
        in_RDI->Readers[local_32c]->Connections = (CP_PeerConnection *)0x0;
      }
      if (in_RDI->Readers[local_32c]->Peers != (int *)0x0) {
        free(in_RDI->Readers[local_32c]->Peers);
      }
    }
    in_RDI->ReaderCount = 0;
    free(in_RDI->Readers);
    in_RDI->Readers = (WS_ReaderInfo *)0x0;
  }
  local_348 = in_RDI->PreviousFormats;
  in_RDI->PreviousFormats = (FFSFormatList)0x0;
  free(in_RDI->ReleaseList);
  free(in_RDI->LockDefnsList);
  while (local_348 != (FFSFormatList)0x0) {
    in_stack_fffffffffffffcb0 = local_348->Next;
    free(local_348->FormatServerRep);
    free(local_348->FormatIDRep);
    free(local_348);
    local_348 = in_stack_fffffffffffffcb0;
  }
  if ((in_RDI->WriterConfigParams != (_SstParams *)0x0) &&
     (in_RDI->WriterConfigParams->MarshalMethod == 0)) {
    FFSFreeMarshalData(Stream_00);
    if (in_RDI->M != (void *)0x0) {
      free(in_RDI->M);
    }
    if (in_RDI->D != (void *)0x0) {
      free(in_RDI->D);
    }
  }
  if (in_RDI->Role == ReaderRole) {
    if (in_RDI->ReaderFFSContext != (FFSContext)0x0) {
      free_FFSContext(in_RDI->ReaderFFSContext);
      in_RDI->ReaderFFSContext = (FFSContext)0x0;
    }
    for (local_354 = 0; local_354 < in_RDI->WriterCohortSize; local_354 = local_354 + 1) {
      free_attr_list(in_RDI->ConnectionsToWriter[local_354].ContactList);
      if (in_RDI->ConnectionsToWriter[local_354].CMconn != (CMConnection)0x0) {
        CMConnection_dereference(in_RDI->ConnectionsToWriter[local_354].CMconn);
        in_RDI->ConnectionsToWriter[local_354].CMconn = (CMConnection)0x0;
      }
    }
    if (in_RDI->ConnectionsToWriter != (CP_PeerConnection *)0x0) {
      free(in_RDI->ConnectionsToWriter);
      in_RDI->ConnectionsToWriter = (CP_PeerConnection *)0x0;
    }
    free(in_RDI->Peers);
    if (in_RDI->RanksRead != (char *)0x0) {
      free(in_RDI->RanksRead);
    }
  }
  else if (in_RDI->ConfigParams->MarshalMethod == 0) {
    FFSFreeMarshalData(Stream_00);
  }
  if (in_RDI->ConfigParams->DataTransport != (char *)0x0) {
    free(in_RDI->ConfigParams->DataTransport);
  }
  if (in_RDI->ConfigParams->WANDataTransport != (char *)0x0) {
    free(in_RDI->ConfigParams->WANDataTransport);
  }
  if (in_RDI->ConfigParams->ControlTransport != (char *)0x0) {
    free(in_RDI->ConfigParams->ControlTransport);
  }
  if (in_RDI->ConfigParams->NetworkInterface != (char *)0x0) {
    free(in_RDI->ConfigParams->NetworkInterface);
  }
  if (in_RDI->ConfigParams->ControlInterface != (char *)0x0) {
    free(in_RDI->ConfigParams->ControlInterface);
  }
  if (in_RDI->ConfigParams->DataInterface != (char *)0x0) {
    free(in_RDI->ConfigParams->DataInterface);
  }
  if (in_RDI->ConfigParams->ControlModule != (char *)0x0) {
    free(in_RDI->ConfigParams->ControlModule);
  }
  if (in_RDI->Filename != (char *)0x0) {
    free(in_RDI->Filename);
    in_RDI->Filename = (char *)0x0;
  }
  if (in_RDI->AbsoluteFilename != (char *)0x0) {
    free(in_RDI->AbsoluteFilename);
    in_RDI->AbsoluteFilename = (char *)0x0;
  }
  if (in_RDI->ParamsBlock != (void *)0x0) {
    free(in_RDI->ParamsBlock);
    in_RDI->ParamsBlock = (void *)0x0;
  }
  if (in_RDI->CPInfo->ffs_c != (FFSContext)0x0) {
    free_FFSContext(in_RDI->CPInfo->ffs_c);
  }
  if (in_RDI->CPInfo->fm_c != (FMContext)0x0) {
    free_FMcontext(in_RDI->CPInfo->fm_c);
  }
  FreeCustomStructs((CP_StructList *)in_stack_fffffffffffffcb0);
  free(in_RDI->CPInfo);
  pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
  pthread_mutex_lock((pthread_mutex_t *)&StateMutex);
  SharedCMInfoRefCount = SharedCMInfoRefCount + -1;
  if (SharedCMInfoRefCount == 0) {
    CP_verbose(in_RDI,PerStepVerbose,"Reference count now zero, Destroying process SST info cache\n"
              );
    CManager_close(SharedCMInfo->cm);
    FreeCustomStructs((CP_StructList *)in_stack_fffffffffffffcb0);
    CP_verbose(in_RDI,PerStepVerbose,"Freeing LastCallList\n");
    for (local_358 = 0; local_358 < SharedCMInfo->LastCallFreeCount; local_358 = local_358 + 1) {
      free(SharedCMInfo->LastCallFreeList[local_358]);
    }
    free(SharedCMInfo->LastCallFreeList);
    free(SharedCMInfo);
    SharedCMInfo = (CP_GlobalCMInfo)0x0;
    if (CP_SstParamsList != (FMField *)0x0) {
      free_FMfield_list(CP_SstParamsList);
    }
    CP_SstParamsList = (FMField *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateMutex);
  CP_verbose((SstStream)local_318,PerStepVerbose,"SstStreamDestroy successful, returning\n");
  return;
}

Assistant:

extern void SstStreamDestroy(SstStream Stream)
{
    /*
     * StackStream is only used to access verbosity info
     * in a safe way after all streams have been destroyed
     */
    struct _SstStream StackStream;
    CP_verbose(Stream, PerStepVerbose, "Destroying stream %p, name %s\n", Stream, Stream->Filename);
    STREAM_MUTEX_LOCK(Stream);
    StackStream = *Stream;
    Stream->Status = Destroyed;
    struct _TimestepMetadataList *Next = Stream->Timesteps;
    while (Next)
    {
        Next = Next->Next;
        free(Stream->Timesteps);
        Stream->Timesteps = Next;
    }

    while (Stream->StepRequestQueue)
    {
        StepRequest Request = Stream->StepRequestQueue;
        Stream->StepRequestQueue = Request->Next;
        free(Request);
    }
    if (Stream->DP_Stream)
    {
        STREAM_MUTEX_UNLOCK(Stream);
        if (Stream->Role == ReaderRole)
        {
            Stream->DP_Interface->destroyReader(&Svcs, Stream->DP_Stream);
        }
        else
        {
            Stream->DP_Interface->destroyWriter(&Svcs, Stream->DP_Stream);
        }
        Stream->DP_Stream = NULL;
        STREAM_MUTEX_LOCK(Stream);
    }

    if (Stream->Readers)
    {
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            CP_PeerConnection *connections_to_reader = Stream->Readers[i]->Connections;

            if (connections_to_reader)
            {
                for (int j = 0; j < Stream->Readers[i]->ReaderCohortSize; j++)
                {
                    if (connections_to_reader[j].CMconn)
                    {
                        CMConnection_dereference(connections_to_reader[j].CMconn);
                        connections_to_reader[j].CMconn = NULL;
                    }
                    free_attr_list(connections_to_reader[j].ContactList);
                }
                free(Stream->Readers[i]->Connections);
                Stream->Readers[i]->Connections = NULL;
            }
            if (Stream->Readers[i]->Peers)
            {
                free(Stream->Readers[i]->Peers);
            }
            // Stream->Readers[i] is free'd in LastCall
        }
        Stream->ReaderCount = 0;
        free(Stream->Readers);
        Stream->Readers = NULL;
    }

    FFSFormatList FFSList = Stream->PreviousFormats;
    Stream->PreviousFormats = NULL;
    free(Stream->ReleaseList);
    free(Stream->LockDefnsList);
    while (FFSList)
    {
        FFSFormatList Tmp = FFSList->Next;
        /* Server rep and ID here are copied */
        free(FFSList->FormatServerRep);
        free(FFSList->FormatIDRep);
        free(FFSList);
        FFSList = Tmp;
    }
    if (Stream->WriterConfigParams && (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS))
    {
        FFSFreeMarshalData(Stream);
        if (Stream->M)
            free(Stream->M);
        if (Stream->D)
            free(Stream->D);
    }

    if (Stream->Role == ReaderRole)
    {
        /* reader side */
        if (Stream->ReaderFFSContext)
        {
            free_FFSContext(Stream->ReaderFFSContext);
            Stream->ReaderFFSContext = NULL;
        }
        for (int i = 0; i < Stream->WriterCohortSize; i++)
        {
            free_attr_list(Stream->ConnectionsToWriter[i].ContactList);
            if (Stream->ConnectionsToWriter[i].CMconn)
            {
                CMConnection_dereference(Stream->ConnectionsToWriter[i].CMconn);
                Stream->ConnectionsToWriter[i].CMconn = NULL;
            }
        }
        if (Stream->ConnectionsToWriter)
        {
            free(Stream->ConnectionsToWriter);
            Stream->ConnectionsToWriter = NULL;
        }
        free(Stream->Peers);
        if (Stream->RanksRead)
            free(Stream->RanksRead);
    }
    else if (Stream->ConfigParams->MarshalMethod == SstMarshalFFS)
    {
        FFSFreeMarshalData(Stream);
    }
    if (Stream->ConfigParams->DataTransport)
        free(Stream->ConfigParams->DataTransport);
    if (Stream->ConfigParams->WANDataTransport)
        free(Stream->ConfigParams->WANDataTransport);
    if (Stream->ConfigParams->ControlTransport)
        free(Stream->ConfigParams->ControlTransport);
    if (Stream->ConfigParams->NetworkInterface)
        free(Stream->ConfigParams->NetworkInterface);
    if (Stream->ConfigParams->ControlInterface)
        free(Stream->ConfigParams->ControlInterface);
    if (Stream->ConfigParams->DataInterface)
        free(Stream->ConfigParams->DataInterface);
    if (Stream->ConfigParams->ControlModule)
        free(Stream->ConfigParams->ControlModule);

    if (Stream->Filename)
    {
        free(Stream->Filename);
        Stream->Filename = NULL;
    }
    if (Stream->AbsoluteFilename)
    {
        free(Stream->AbsoluteFilename);
        Stream->AbsoluteFilename = NULL;
    }

    if (Stream->ParamsBlock)
    {
        free(Stream->ParamsBlock);
        Stream->ParamsBlock = NULL;
    }
    if (Stream->CPInfo->ffs_c)
        free_FFSContext(Stream->CPInfo->ffs_c);
    if (Stream->CPInfo->fm_c)
        free_FMcontext(Stream->CPInfo->fm_c);
    FreeCustomStructs(&Stream->CPInfo->CustomStructs);
    free(Stream->CPInfo);

    STREAM_MUTEX_UNLOCK(Stream);
    //   Stream is free'd in LastCall

    pthread_mutex_lock(&StateMutex);
    SharedCMInfoRefCount--;
    if (SharedCMInfoRefCount == 0)
    {
        CP_verbose(Stream, PerStepVerbose,
                   "Reference count now zero, Destroying process SST info cache\n");
        CManager_close(SharedCMInfo->cm);
        FreeCustomStructs(&SharedCMInfo->CustomStructs);
        CP_verbose(Stream, PerStepVerbose, "Freeing LastCallList\n");
        for (int i = 0; i < SharedCMInfo->LastCallFreeCount; i++)
        {
            free(SharedCMInfo->LastCallFreeList[i]);
        }
        free(SharedCMInfo->LastCallFreeList);
        free(SharedCMInfo);
        SharedCMInfo = NULL;
        if (CP_SstParamsList)
            free_FMfield_list(CP_SstParamsList);
        CP_SstParamsList = NULL;
    }
    pthread_mutex_unlock(&StateMutex);
    CP_verbose(&StackStream, PerStepVerbose, "SstStreamDestroy successful, returning\n");
}